

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minicrypto.c
# Opt level: O3

void test_hrr(void)

{
  ptls_key_exchange_algorithm_t *ppVar1;
  int iVar2;
  ptls_t *ppVar3;
  ptls_t *tls;
  size_t consumed;
  ptls_buffer_t decbuf;
  ptls_buffer_t sbuf;
  ptls_buffer_t cbuf;
  ptls_key_exchange_algorithm_t *client_keyex [3];
  uint8_t decbuf_small [16384];
  uint8_t sbuf_small [16384];
  uint8_t cbuf_small [16384];
  size_t local_c188;
  ptls_t *local_c180;
  ptls_buffer_t local_c178;
  ptls_buffer_t local_c158;
  ptls_buffer_t local_c138;
  ptls_key_exchange_algorithm_t *local_c118;
  ptls_key_exchange_algorithm_t *ppStack_c110;
  undefined8 local_c108;
  ptls_context_t local_c100;
  long local_c038 [2048];
  uint8_t local_8038 [16384];
  uint8_t local_4038 [16392];
  
  local_c108 = 0;
  local_c118 = &ptls_minicrypto_x25519;
  ppStack_c110 = &ptls_minicrypto_secp256r1;
  memset(&local_c100.certificates,0,0xa8);
  local_c100.random_bytes = ptls_minicrypto_random_bytes;
  local_c100.get_time = &ptls_get_time;
  local_c100.cipher_suites = ptls_minicrypto_cipher_suites;
  ppVar1 = *ctx_peer->key_exchanges;
  local_c100.key_exchanges = &local_c118;
  if ((ppVar1 != (ptls_key_exchange_algorithm_t *)0x0) && (ppVar1->id == 0x17)) {
    if (ctx_peer->key_exchanges[1] == (ptls_key_exchange_algorithm_t *)0x0) {
      ppVar3 = ptls_new(&local_c100,0);
      local_c180 = ppVar3;
      tls = ptls_new(ctx_peer,1);
      local_c138.base = local_4038;
      local_c138.off = 0;
      local_c138.capacity = 0x4000;
      local_c138._24_8_ = (ulong)(uint)local_c138._28_4_ << 0x20;
      local_c158.base = local_8038;
      local_c158.off = 0;
      local_c158.capacity = 0x4000;
      local_c158._24_8_ = (ulong)(uint)local_c158._28_4_ << 0x20;
      local_c178.base = (uint8_t *)local_c038;
      local_c178.off = 0;
      local_c178.capacity = 0x4000;
      local_c178._24_8_ = (ulong)(uint)local_c178._28_4_ << 0x20;
      iVar2 = ptls_handshake(ppVar3,&local_c138,(void *)0x0,(size_t *)0x0,
                             (ptls_handshake_properties_t *)0x0);
      _ok((uint)(iVar2 == 0x202),"%s %d",
          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",0x56)
      ;
      local_c188 = local_c138.off;
      iVar2 = ptls_handshake(tls,&local_c158,local_c138.base,&local_c188,
                             (ptls_handshake_properties_t *)0x0);
      _ok((uint)(iVar2 == 0x202),"%s %d",
          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",0x5a)
      ;
      _ok((uint)(local_c188 == local_c138.off),"%s %d",
          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",0x5b)
      ;
      local_c138.off = 0;
      _ok((uint)(9 < local_c158.off),"%s %d",
          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",0x5e)
      ;
      _ok((uint)(local_c158.base[5] == '\x02'),"%s %d",
          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",0x5f)
      ;
      local_c188 = local_c158.off;
      iVar2 = ptls_handshake(local_c180,&local_c138,local_c158.base,&local_c188,
                             (ptls_handshake_properties_t *)0x0);
      _ok((uint)(iVar2 == 0x202),"%s %d",
          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",99);
      _ok((uint)(local_c188 == local_c158.off),"%s %d",
          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",100);
      local_c158.off = 0;
      _ok((uint)(8 < local_c138.off),"%s %d",
          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",0x67)
      ;
      _ok((uint)(local_c138.base[5] == '\x01'),"%s %d",
          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",0x68)
      ;
      local_c188 = local_c138.off;
      iVar2 = ptls_handshake(tls,&local_c158,local_c138.base,&local_c188,
                             (ptls_handshake_properties_t *)0x0);
      if (iVar2 == 0x202) {
        do {
          usleep(100);
          iVar2 = ptls_handshake(tls,&local_c158,local_c138.base,&local_c188,
                                 (ptls_handshake_properties_t *)0x0);
        } while (iVar2 == 0x202);
      }
      _ok((uint)(iVar2 == 0),"%s %d",
          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",0x72)
      ;
      _ok((uint)(local_c188 == local_c138.off),"%s %d",
          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",0x73)
      ;
      local_c138.off = 0;
      _ok((uint)(8 < local_c158.off),"%s %d",
          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",0x76)
      ;
      _ok((uint)(local_c158.base[5] == '\x02'),"%s %d",
          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",0x77)
      ;
      ppVar3 = local_c180;
      local_c188 = local_c158.off;
      iVar2 = ptls_handshake(local_c180,&local_c138,local_c158.base,&local_c188,
                             (ptls_handshake_properties_t *)0x0);
      _ok((uint)(iVar2 == 0),"%s %d",
          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",0x7b)
      ;
      _ok((uint)(local_c188 == local_c158.off),"%s %d",
          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",0x7c)
      ;
      local_c158.off = 0;
      iVar2 = ptls_send(ppVar3,&local_c138,"hello world",0xb);
      _ok((uint)(iVar2 == 0),"%s %d",
          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",0x80)
      ;
      local_c188 = local_c138.off;
      iVar2 = ptls_receive(tls,&local_c178,local_c138.base,&local_c188);
      _ok((uint)(iVar2 == 0),"%s %d",
          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",0x84)
      ;
      _ok((uint)(local_c188 == local_c138.off),"%s %d",
          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",0x85)
      ;
      local_c138.off = 0;
      _ok((uint)(local_c178.off == 0xb),"%s %d",
          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",0x88)
      ;
      _ok((uint)(*(long *)((long)local_c178.base + 3) == 0x646c726f77206f6c &&
                *(long *)local_c178.base == 0x6f77206f6c6c6568),"%s %d",
          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",0x89)
      ;
      ptls_buffer__release_memory(&local_c178);
      local_c178.off = 0;
      local_c178.is_allocated = 0;
      local_c178._28_4_ = 0;
      local_c178.base = (uint8_t *)0x0;
      local_c178.capacity = 0;
      ptls_buffer__release_memory(&local_c158);
      local_c158.off = 0;
      local_c158.is_allocated = 0;
      local_c158._28_4_ = 0;
      local_c158.base = (uint8_t *)0x0;
      local_c158.capacity = 0;
      ptls_buffer__release_memory(&local_c138);
      local_c138.off = 0;
      local_c138.is_allocated = 0;
      local_c138._28_4_ = 0;
      local_c138.base = (uint8_t *)0x0;
      local_c138.capacity = 0;
      ptls_free(local_c180);
      ptls_free(tls);
      return;
    }
    __assert_fail("ctx_peer->key_exchanges[1] == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c"
                  ,0x4d,"void test_hrr(void)");
  }
  __assert_fail("ctx_peer->key_exchanges[0] != NULL && ctx_peer->key_exchanges[0]->id == PTLS_GROUP_SECP256R1"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c"
                ,0x4c,"void test_hrr(void)");
}

Assistant:

static void test_hrr(void)
{
    ptls_key_exchange_algorithm_t *client_keyex[] = {&ptls_minicrypto_x25519, &ptls_minicrypto_secp256r1, NULL};
    ptls_context_t client_ctx = {ptls_minicrypto_random_bytes, &ptls_get_time, client_keyex, ptls_minicrypto_cipher_suites};
    ptls_t *client, *server;
    ptls_buffer_t cbuf, sbuf, decbuf;
    uint8_t cbuf_small[16384], sbuf_small[16384], decbuf_small[16384];
    size_t consumed;
    int ret;

    assert(ctx_peer->key_exchanges[0] != NULL && ctx_peer->key_exchanges[0]->id == PTLS_GROUP_SECP256R1);
    assert(ctx_peer->key_exchanges[1] == NULL);

    client = ptls_new(&client_ctx, 0);
    server = ptls_new(ctx_peer, 1);
    ptls_buffer_init(&cbuf, cbuf_small, sizeof(cbuf_small));
    ptls_buffer_init(&sbuf, sbuf_small, sizeof(sbuf_small));
    ptls_buffer_init(&decbuf, decbuf_small, sizeof(decbuf_small));

    ret = ptls_handshake(client, &cbuf, NULL, NULL, NULL);
    ok(ret == PTLS_ERROR_IN_PROGRESS);

    consumed = cbuf.off;
    ret = ptls_handshake(server, &sbuf, cbuf.base, &consumed, NULL);
    ok(ret == PTLS_ERROR_IN_PROGRESS);
    ok(consumed == cbuf.off);
    cbuf.off = 0;

    ok(sbuf.off > 5 + 4);
    ok(sbuf.base[5] == 2 /* PTLS_HANDSHAKE_TYPE_SERVER_HELLO (RETRY_REQUEST) */);

    consumed = sbuf.off;
    ret = ptls_handshake(client, &cbuf, sbuf.base, &consumed, NULL);
    ok(ret == PTLS_ERROR_IN_PROGRESS);
    ok(consumed == sbuf.off);
    sbuf.off = 0;

    ok(cbuf.off >= 5 + 4);
    ok(cbuf.base[5] == 1 /* PTLS_HANDSHAKE_TYPE_CLIENT_HELLO */);

    consumed = cbuf.off;
    do
    {
        ret = ptls_handshake(server, &sbuf, cbuf.base, &consumed, NULL);
        if (ret == PTLS_ERROR_IN_PROGRESS)
            usleep(100);
    }
    while (ret == PTLS_ERROR_IN_PROGRESS);
    ok(ret == 0);
    ok(consumed == cbuf.off);
    cbuf.off = 0;

    ok(sbuf.off >= 5 + 4);
    ok(sbuf.base[5] == 2 /* PTLS_HANDSHAKE_TYPE_SERVER_HELLO */);

    consumed = sbuf.off;
    ret = ptls_handshake(client, &cbuf, sbuf.base, &consumed, NULL);
    ok(ret == 0);
    ok(consumed == sbuf.off);
    sbuf.off = 0;

    ret = ptls_send(client, &cbuf, "hello world", 11);
    ok(ret == 0);

    consumed = cbuf.off;
    ret = ptls_receive(server, &decbuf, cbuf.base, &consumed);
    ok(ret == 0);
    ok(consumed == cbuf.off);
    cbuf.off = 0;

    ok(decbuf.off == 11);
    ok(memcmp(decbuf.base, "hello world", 11) == 0);

    ptls_buffer_dispose(&decbuf);
    ptls_buffer_dispose(&sbuf);
    ptls_buffer_dispose(&cbuf);
    ptls_free(client);
    ptls_free(server);
}